

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
::get_content(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
             List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
             *this,int columnLength)

{
  bool bVar1;
  ID_index IVar2;
  size_type sVar3;
  const_reference ppEVar4;
  reference ppEVar5;
  bool bVar6;
  reference rVar7;
  reference local_50;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  allocator<bool> local_1f;
  bool local_1e [2];
  uint local_1c;
  List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  *pLStack_18;
  int columnLength_local;
  List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  *this_local;
  vector<bool,_std::allocator<bool>_> *container;
  
  local_1c = columnLength;
  pLStack_18 = this;
  this_local = (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
                *)__return_storage_ptr__;
  if ((columnLength < 0) &&
     (sVar3 = std::__cxx11::
              list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
              ::size(&this->column_), sVar3 != 0)) {
    ppEVar4 = std::__cxx11::
              list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
              ::back(&this->column_);
    IVar2 = Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
            ::get_row_index(*ppEVar4);
    local_1c = IVar2 + 1;
  }
  else if ((int)local_1c < 0) {
    memset(__return_storage_ptr__,0,0x28);
    std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_1e[1] = false;
  sVar3 = (size_type)(int)local_1c;
  local_1e[0] = false;
  std::allocator<bool>::allocator(&local_1f);
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__,sVar3,local_1e,&local_1f);
  std::allocator<bool>::~allocator(&local_1f);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
       ::begin(&this->column_);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
         ::end(&this->column_);
    bVar1 = std::operator!=(&local_38,&local_40);
    bVar6 = false;
    if (bVar1) {
      ppEVar5 = std::
                _List_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>
                ::operator*(&local_38);
      IVar2 = Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
              ::get_row_index(*ppEVar5);
      bVar6 = IVar2 < local_1c;
    }
    if (!bVar6) break;
    ppEVar5 = std::
              _List_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>
              ::operator*(&local_38);
    IVar2 = Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
            ::get_row_index(*ppEVar5);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (__return_storage_ptr__,(ulong)IVar2);
    local_50 = rVar7;
    std::_Bit_reference::operator=(&local_50,true);
    std::
    _List_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>
    ::operator++(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename List_column<Master_matrix>::Field_element> List_column<Master_matrix>::get_content(
    int columnLength) const
{
  if (columnLength < 0 && column_.size() > 0)
    columnLength = column_.back()->get_row_index() + 1;
  else if (columnLength < 0)
    return std::vector<Field_element>();

  std::vector<Field_element> container(columnLength, 0);
  for (auto it = column_.begin(); it != column_.end() && (*it)->get_row_index() < static_cast<ID_index>(columnLength);
       ++it) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      container[(*it)->get_row_index()] = 1;
    } else {
      container[(*it)->get_row_index()] = (*it)->get_element();
    }
  }
  return container;
}